

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

string * __thiscall
SchemePair::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemePair *this)

{
  _Base_ptr *pp_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  long lVar4;
  long *plVar5;
  SchemePair *pSVar6;
  _Rb_tree_node_base **pp_Var7;
  _Rb_tree_node_base *p_Var8;
  size_type *psVar9;
  char *pcVar10;
  SchemePair *pSVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  undefined1 auVar16 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  element_type *peVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  initializer_list<const_SchemePair_*> __l;
  string res;
  shared_ptr<SchemeObject> p;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  SchemePair *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  element_type *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_c8;
  _Base_ptr *local_b8;
  long local_b0;
  _Rb_tree_node_base *local_a8;
  long lStack_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [8];
  _Rb_tree_node_base local_80;
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_50;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40 [2];
  
  peVar17 = (this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar17 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"()","");
    return __return_storage_ptr__;
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar4 = __dynamic_cast(peVar17,&SchemeObject::typeinfo,&SchemeSymbol::typeinfo,0);
  if (lVar4 == 0) goto LAB_00126578;
  this_00 = (this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pp_Var1 = &local_80._M_parent;
  local_88 = (undefined1  [8])pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  pcVar10 = (char *)(lVar4 + 8);
  iVar3 = std::__cxx11::string::compare(pcVar10);
  if (iVar3 == 0) {
    pcVar10 = "\'";
LAB_001264bc:
    std::__cxx11::string::_M_replace((ulong)local_88,0,(char *)local_80._0_8_,(ulong)pcVar10);
  }
  else {
    iVar3 = std::__cxx11::string::compare(pcVar10);
    if (iVar3 == 0) {
      pcVar10 = "`";
      goto LAB_001264bc;
    }
    iVar3 = std::__cxx11::string::compare(pcVar10);
    if (iVar3 == 0) {
      pcVar10 = ",";
      goto LAB_001264bc;
    }
    iVar3 = std::__cxx11::string::compare(pcVar10);
    if (iVar3 == 0) {
      std::__cxx11::string::operator=((string *)local_88,",@");
    }
  }
  if ((((char *)local_80._0_8_ != (char *)0x0) &&
      (peVar17 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar17 != (element_type *)0x0)) &&
     (lVar4 = __dynamic_cast(peVar17,&SchemeObject::typeinfo,&typeinfo,0), lVar4 != 0)) {
    p_Var18 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (*(element_type **)(lVar4 + 0x18) ==
          scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      goto LAB_00126ac4;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
      }
      if (*(element_type **)(lVar4 + 0x18) ==
          scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
LAB_00126ac4:
        (**(code **)(**(long **)(lVar4 + 8) + 0x10))(&local_b8);
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_b8,0,(char *)0x0,(ulong)local_88);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar9) {
          lVar4 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,(ulong)((long)&local_a8->_M_color + 1));
        }
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        auVar16 = local_88;
        if (local_88 == (undefined1  [8])pp_Var1) goto LAB_00126aa2;
        goto LAB_00126a9a;
      }
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
      }
    }
  }
  if (local_88 != (undefined1  [8])pp_Var1) {
    operator_delete((void *)local_88,(ulong)((long)&(local_80._M_parent)->_M_color + 1));
  }
  peVar17 = (this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00126578:
  (*peVar17->_vptr_SchemeObject[2])(local_88);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x14d46f);
  local_b8 = &local_a8;
  pp_Var7 = (_Rb_tree_node_base **)(plVar5 + 2);
  if ((_Base_ptr *)*plVar5 == pp_Var7) {
    local_a8 = *pp_Var7;
    lStack_a0 = plVar5[3];
  }
  else {
    local_a8 = *pp_Var7;
    local_b8 = (_Base_ptr *)*plVar5;
  }
  local_b0 = plVar5[1];
  *plVar5 = (long)pp_Var7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_88 != (undefined1  [8])&local_80._M_parent) {
    operator_delete((void *)local_88,(ulong)((long)&(local_80._M_parent)->_M_color + 1));
  }
  local_98 = (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90._M_pi =
       (this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_f8;
  local_f8 = this;
  local_58 = __return_storage_ptr__;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )local_88,__l,(less<const_SchemePair_*> *)&local_d8,(allocator_type *)&local_50);
  p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    if (local_98 == (element_type *)0x0) {
      pSVar6 = (SchemePair *)0x0;
LAB_001266d2:
      pSVar11 = pSVar6;
      _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      pSVar6 = (SchemePair *)__dynamic_cast(local_98,&SchemeObject::typeinfo,&typeinfo,0);
      pSVar11 = (SchemePair *)0x0;
      _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (pSVar6 != (SchemePair *)0x0) {
        if (local_90._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001266d2;
        pSVar11 = pSVar6;
        _Var12._M_pi = local_90._M_pi;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
        }
      }
    }
    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
    }
    __return_storage_ptr__ = local_58;
    if (pSVar11 == (SchemePair *)0x0) {
      local_d8._M_pi = &local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_b8,local_b0 + (long)local_b8);
      std::__cxx11::string::append((char *)&local_d8);
      __return_storage_ptr__ = local_58;
      (*local_98->_vptr_SchemeObject[2])(&local_50);
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&local_d0->_vptr_SchemeObject + local_48);
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      if (local_d8._M_pi != &local_c8) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._vptr__Sp_counted_base;
      }
      if (p_Var15 < p_Var18) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if (local_50 != local_40) {
          p_Var15 = local_40[0];
        }
        if (p_Var15 < p_Var18) goto LAB_001268dc;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,(ulong)local_d8._M_pi);
      }
      else {
LAB_001268dc:
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
      }
      pSVar6 = (SchemePair *)(plVar5 + 2);
      if ((SchemePair *)*plVar5 == pSVar6) {
        local_e8._0_8_ = (pSVar6->super_SchemeObject)._vptr_SchemeObject;
        local_e8._8_8_ = plVar5[3];
        local_f8 = (SchemePair *)local_e8;
      }
      else {
        local_e8._0_8_ = (pSVar6->super_SchemeObject)._vptr_SchemeObject;
        local_f8 = (SchemePair *)*plVar5;
      }
      local_f0 = plVar5[1];
      *plVar5 = (long)pSVar6;
      plVar5[1] = 0;
      *(undefined1 *)&(pSVar6->super_SchemeObject)._vptr_SchemeObject = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        lVar4 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_f8 != (SchemePair *)local_e8) {
        operator_delete(local_f8,local_e8._0_8_ + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,(ulong)((long)&local_40[0]->_vptr__Sp_counted_base + 1));
      }
      if (local_d8._M_pi != &local_c8) {
        operator_delete(local_d8._M_pi,
                        (ulong)((long)(_func_int ***)local_c8._vptr__Sp_counted_base + 1));
      }
      goto LAB_00126a58;
    }
    if (local_98 == scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    {
      (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_b8,local_b0 + (long)local_b8);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_00126a58;
    }
    (*((pSVar11->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_SchemeObject[2])(&local_d8);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x152040);
    pSVar6 = (SchemePair *)(plVar5 + 2);
    if ((SchemePair *)*plVar5 == pSVar6) {
      local_e8._0_8_ = (pSVar6->super_SchemeObject)._vptr_SchemeObject;
      local_e8._8_8_ = plVar5[3];
      local_f8 = (SchemePair *)local_e8;
    }
    else {
      local_e8._0_8_ = (pSVar6->super_SchemeObject)._vptr_SchemeObject;
      local_f8 = (SchemePair *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)pSVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_f8);
    if (local_f8 != (SchemePair *)local_e8) {
      operator_delete(local_f8,local_e8._0_8_ + 1);
    }
    if (local_d8._M_pi != &local_c8) {
      operator_delete(local_d8._M_pi,
                      (ulong)((long)(_func_int ***)local_c8._vptr__Sp_counted_base + 1));
    }
    __return_storage_ptr__ = local_58;
    p_Var2 = local_80._M_parent;
    p_Var14 = &local_80;
    if (local_80._M_parent != (_Rb_tree_node_base *)0x0) {
      do {
        p_Var13 = p_Var14;
        p_Var8 = p_Var2;
        pSVar6 = *(SchemePair **)(p_Var8 + 1);
        p_Var14 = p_Var8;
        if (pSVar6 < pSVar11) {
          p_Var14 = p_Var13;
        }
        p_Var2 = (&p_Var8->_M_left)[pSVar6 < pSVar11];
      } while ((&p_Var8->_M_left)[pSVar6 < pSVar11] != (_Base_ptr)0x0);
      if (p_Var14 != &local_80) {
        if (pSVar6 < pSVar11) {
          p_Var8 = p_Var13;
        }
        if (*(SchemePair **)(p_Var8 + 1) <= pSVar11) break;
      }
    }
    local_98 = (pSVar11->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_90,
               &(pSVar11->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_f8 = pSVar11;
    std::
    _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
    ::_M_insert_unique<SchemePair_const*>
              ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                *)local_88,&local_f8);
    p_Var18 = _Var12._M_pi;
  } while( true );
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_b8,local_b0 + (long)local_b8);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00126a58:
  std::
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  ::~_Rb_tree((_Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
               *)local_88);
  if (_Var12._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var12._M_pi);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  local_80._M_parent = local_a8;
  auVar16 = (undefined1  [8])local_b8;
  if (local_b8 == &local_a8) goto LAB_00126aa2;
LAB_00126a9a:
  operator_delete((void *)auVar16,(ulong)((long)&(local_80._M_parent)->_M_color + 1));
LAB_00126aa2:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SchemePair::external_repr() const
{
    if(!car)
        return "()";
    auto pcar = std::dynamic_pointer_cast<SchemeSymbol>(car);
    if(pcar)
    {
        std::string prefix = "";
        if(pcar->value == "quote")
            prefix = "'";
        else if(pcar->value == "quasiquote")
            prefix = "`";
        else if(pcar->value == "unquote")
            prefix = ",";
        else if(pcar->value == "unquote-splicing")
            prefix = ",@";
        if(prefix.length())
        {
            auto pcdr = std::dynamic_pointer_cast<SchemePair>(cdr);
            if(pcdr && pcdr->cdr == scheme_nil)
                return prefix + pcdr->car->external_repr();
        }
    }
    std::string res = "(" + car->external_repr();
    std::shared_ptr<SchemeObject> p = cdr;
    std::shared_ptr<SchemePair> pp;
    std::set<const SchemePair *> visited{this};
    while((pp = std::dynamic_pointer_cast<SchemePair>(p)))
    {
        if(p == scheme_nil)
            return res + ")";
        res += " " + pp->car->external_repr();
        if(visited.count(pp.get()))
            return res + " ...)";
        p = pp->cdr;
        visited.insert(pp.get());
    }
    return res + " . " + p->external_repr() + ")";
}